

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O3

void __thiscall
TasGrid::GridWavelet::evaluateGpuMixed(GridWavelet *this,double *x,int num_x,double *y)

{
  Data2D<double> weights;
  allocator_type local_59;
  long local_58;
  long local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  loadGpuCoefficients<double>(this);
  local_58 = (long)(this->super_BaseCanonicalGrid).points.cache_num_indexes;
  local_50 = (long)num_x;
  ::std::vector<double,_std::allocator<double>_>::vector(&local_48,local_58 * local_50,&local_59);
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x20])
            (this,x,(ulong)(uint)num_x,
             local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  TasGpu::denseMultiplyMixed<double>
            ((this->super_BaseCanonicalGrid).acceleration,
             (this->super_BaseCanonicalGrid).num_outputs,num_x,
             (this->super_BaseCanonicalGrid).points.cache_num_indexes,1.0,
             &((this->gpu_cache)._M_t.
               super___uniq_ptr_impl<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
               .super__Head_base<0UL,_TasGrid::CudaWaveletData<double>_*,_false>._M_head_impl)->
              coefficients,
             local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,0.0,y);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridWavelet::evaluateGpuMixed(const double x[], int num_x, double y[]) const{
    loadGpuCoefficients<double>();

    Data2D<double> weights(points.getNumIndexes(), num_x);
    evaluateHierarchicalFunctions(x, num_x, weights.getStrip(0));

    TasGpu::denseMultiplyMixed(acceleration, num_outputs, num_x, points.getNumIndexes(), 1.0, gpu_cache->coefficients, weights.data(), 0.0, y);
}